

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  runtime_error *this;
  long local_1e8;
  stringstream ss;
  ostream local_1d8 [16];
  byte abStack_1c8 [360];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1e8);
  std::operator<<(local_1d8,(string *)_source);
  std::istream::operator>>((istream *)&local_1e8,_dest);
  if ((abStack_1c8[*(long *)(local_1e8 + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e8);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Unable to convert ",_source);
  std::operator+(&local_60,&local_40," to destination type");
  std::runtime_error::runtime_error(this,(string *)&local_60);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }